

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O2

const_iterator __thiscall
QMimeBinaryProvider::loadMimeTypeExtra(QMimeBinaryProvider *this,QString *mimeName)

{
  _Rb_tree_header *p_Var1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  bool bVar5;
  int iVar6;
  iterator iVar7;
  QDebug *pQVar8;
  int __oflag;
  QString *pQVar9;
  long in_FS_OFFSET;
  QAnyStringView qualifiedName;
  QAnyStringView qualifiedName_00;
  QLatin1StringView other;
  QAnyStringView qualifiedName_01;
  pair<std::_Rb_tree_iterator<std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>_>,_bool>
  pVar10;
  QStringView QVar11;
  QStringView local_138;
  QStringView local_128;
  QStringView local_118;
  QXmlStreamReader xml;
  QFile local_f8;
  QMessageLogger local_e8;
  QArrayDataPointer<char16_t> local_c8;
  undefined1 local_a8 [8];
  char16_t *pcStack_a0;
  QArrayDataPointer<char16_t> local_98;
  QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QString>,_QLatin1String>
  local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar7 = std::
          _Rb_tree<QString,_std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>,_std::_Select1st<std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>_>_>
          ::find(&(this->m_mimetypeExtra)._M_t,mimeName);
  p_Var1 = &(this->m_mimetypeExtra)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar7._M_node != p_Var1) goto LAB_0044a26c;
  local_c8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_c8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_c8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar9 = &(this->super_QMimeProviderBase).m_directory;
  QString::toLower_helper((QString *)&local_e8,mimeName);
  local_98.size = (qsizetype)local_e8.context.function;
  local_98.ptr = (char16_t *)local_e8.context.file;
  local_98.d = (Data *)local_e8.context._0_8_;
  pcStack_a0 = (char16_t *)CONCAT62(pcStack_a0._2_6_,0x2f);
  local_e8.context._0_8_ = (Data *)0x0;
  local_e8.context.file = (char *)0x0;
  local_e8.context.function = (char *)0x0;
  local_a8 = (undefined1  [8])pQVar9;
  QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QString>::QStringBuilder
            (&local_78.a,(QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QString> *)local_a8);
  local_78.b.m_size = 4;
  local_78.b.m_data = ".xml";
  QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QString>,_QLatin1String>::
  convertTo<QString>((QString *)&local_c8,&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78.a.b.d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
  bVar5 = QFile::exists((QString *)&local_c8);
  if (!bVar5) {
    local_78.a.a.b = L'/';
    local_78.a.b.d.ptr = (char16_t *)0x4;
    local_78.a.b.d.size = 0x5422ac;
    local_78.a.a.a = pQVar9;
    local_78.a.b.d.d = (Data *)mimeName;
    QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char16_t>,_const_QString_&>,_QLatin1String>
    ::convertTo<QString>
              ((QString *)local_a8,
               (QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char16_t>,_const_QString_&>,_QLatin1String>
                *)&local_78);
    qVar4 = local_c8.size;
    pcVar3 = local_c8.ptr;
    pDVar2 = local_c8.d;
    local_c8.d = (Data *)local_a8;
    local_c8.ptr = pcStack_a0;
    local_a8 = (undefined1  [8])pDVar2;
    pcStack_a0 = pcVar3;
    local_c8.size = (qsizetype)local_98.d;
    local_98.d = (Data *)qVar4;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_a8);
  }
  local_f8.super_QFileDevice.super_QIODevice.super_QObject._vptr_QObject =
       (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  local_f8.super_QFileDevice.super_QIODevice.super_QObject.d_ptr.d =
       (QObjectData *)&DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile(&local_f8,(QString *)&local_c8);
  iVar6 = QFile::open(&local_f8,(char *)0x1,__oflag);
  if ((char)iVar6 != '\0') {
    pVar10 = std::
             map<QString,_QMimeBinaryProvider::MimeTypeExtra,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>_>_>
             ::try_emplace<>(&this->m_mimetypeExtra,mimeName);
    iVar7._M_node = (_Base_ptr)pVar10.first._M_node;
    local_98.d = (Data *)0x0;
    local_a8 = (undefined1  [8])0x0;
    pcStack_a0 = (char16_t *)0x0;
    xml.d_ptr._M_t.
    super___uniq_ptr_impl<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>.
    _M_t.
    super__Tuple_impl<0UL,_QXmlStreamReaderPrivate_*,_std::default_delete<QXmlStreamReaderPrivate>_>
    .super__Head_base<0UL,_QXmlStreamReaderPrivate_*,_false>._M_head_impl =
         (unique_ptr<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>)
         &DAT_aaaaaaaaaaaaaaaa;
    QXmlStreamReader::QXmlStreamReader(&xml,(QIODevice *)&local_f8);
    bVar5 = QXmlStreamReader::readNextStartElement(&xml);
    if (!bVar5) {
LAB_0044a1be:
      if (local_98.d != (Data *)0x0) {
        if (iVar7._M_node[2]._M_left != (_Base_ptr)0x0) {
          bVar5 = ::operator!=((QString *)iVar7._M_node[2]._M_parent,(QString *)local_a8);
          if (!bVar5) goto LAB_0044a209;
        }
        QtPrivate::sequential_erase_with_copy<QList<QString>,QString>
                  ((QList<QString> *)(iVar7._M_node + 2),(QString *)local_a8);
        QList<QString>::emplaceFront<QString_const&>
                  ((QList<QString> *)(iVar7._M_node + 2),(QString *)local_a8);
      }
LAB_0044a209:
      QXmlStreamReader::~QXmlStreamReader(&xml);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_a8);
      QFile::~QFile(&local_f8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
      goto LAB_0044a26c;
    }
    QVar11 = QXmlStreamReader::name(&xml);
    local_78.a.a.a._0_4_ = (undefined4)QVar11.m_size;
    local_78.a.a.a._4_4_ = QVar11.m_size._4_4_;
    local_78.a.a.b = (char16_t)QVar11.m_data;
    local_78.a.a._10_2_ = QVar11.m_data._2_2_;
    local_78.a.a._12_4_ = QVar11.m_data._4_4_;
    local_e8.context._0_8_ = (Data *)0x9;
    local_e8.context.file = "mime-type";
    bVar5 = ::operator!=((QStringView *)&local_78,(QLatin1StringView *)&local_e8);
    if (!bVar5) {
      local_118.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
      local_118.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QXmlStreamReader::attributes((QXmlStreamAttributes *)&local_78,&xml);
      qualifiedName.m_size = 0x4000000000000004;
      qualifiedName.field_0.m_data_utf8 = "type";
      local_118 = QXmlStreamAttributes::value((QXmlStreamAttributes *)&local_78,qualifiedName);
      QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer
                ((QArrayDataPointer<QXmlStreamAttribute> *)&local_78);
      if (local_118.m_size != 0) {
        QVar11.m_data = (mimeName->d).ptr;
        QVar11.m_size = (mimeName->d).size;
        iVar6 = QStringView::compare(&local_118,QVar11,CaseInsensitive);
        if (iVar6 != 0) {
          local_78.a.a.a._0_4_ = 2;
          local_78.a.b.d.d._4_4_ = 0;
          local_78.a.a.a._4_4_ = 0;
          local_78.a.a.b = L'\0';
          local_78.a.a._10_2_ = 0;
          local_78.a.a._12_4_ = 0;
          local_78.a.b.d.d._0_4_ = 0;
          local_78.a.b.d.ptr = L"default";
          QMessageLogger::warning(&local_e8);
          pQVar8 = QDebug::operator<<((QDebug *)&local_e8,"Got name");
          pQVar8 = QDebug::operator<<(pQVar8,local_118);
          pQVar8 = QDebug::operator<<(pQVar8,"in file");
          pQVar8 = QDebug::operator<<(pQVar8,(QString *)&local_c8);
          pQVar8 = QDebug::operator<<(pQVar8,"expected");
          QDebug::operator<<(pQVar8,mimeName);
          QDebug::~QDebug((QDebug *)&local_e8);
        }
        while( true ) {
          bVar5 = QXmlStreamReader::readNextStartElement(&xml);
          if (!bVar5) break;
          local_128.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
          local_128.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_128 = QXmlStreamReader::name(&xml);
          local_78.a.a.a._0_4_ = 7;
          local_78.a.a.a._4_4_ = 0;
          local_78.a.a.b = L'♇';
          local_78.a.a._10_2_ = 0x54;
          local_78.a.a._12_4_ = 0;
          bVar5 = ::comparesEqual((QLatin1StringView *)&local_78,&local_128);
          if (bVar5) {
            local_78.a.b.d.d._0_4_ = 0xaaaaaaaa;
            local_78.a.b.d.d._4_4_ = 0xaaaaaaaa;
            local_78.a.a.a._0_4_ = 0xaaaaaaaa;
            local_78.a.a.a._4_4_ = 0xaaaaaaaa;
            local_78.a.a.b = L'ꪪ';
            local_78.a.a._10_2_ = 0xaaaa;
            local_78.a.a._12_4_ = 0xaaaaaaaa;
            QXmlStreamReader::attributes((QXmlStreamAttributes *)&local_e8,&xml);
            qualifiedName_00.m_size = 0x4000000000000008;
            qualifiedName_00.field_0.m_data_utf8 = "xml:lang";
            local_138 = QXmlStreamAttributes::value
                                  ((QXmlStreamAttributes *)&local_e8,qualifiedName_00);
            QStringView::toString((QString *)&local_78,&local_138);
            QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer
                      ((QArrayDataPointer<QXmlStreamAttribute> *)&local_e8);
            local_e8.context.function = &DAT_aaaaaaaaaaaaaaaa;
            local_e8.context._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_e8.context.file = &DAT_aaaaaaaaaaaaaaaa;
            QXmlStreamReader::readElementText((QString *)&local_e8,&xml,ErrorOnUnexpectedElement);
            if (CONCAT44(local_78.a.b.d.d._4_4_,local_78.a.b.d.d._0_4_) == 0) {
              other.m_data = "default";
              other.m_size = 7;
              QString::operator=((QString *)&local_78,other);
            }
            QHash<QString,QString>::emplace<QString_const&>
                      ((QHash<QString,QString> *)&iVar7._M_node[1]._M_right,(QString *)&local_78,
                       (QString *)&local_e8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_e8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_78);
          }
          else {
            local_78.a.a.a._0_4_ = 0xe;
            local_78.a.a.a._4_4_ = 0;
            local_78.a.a.b = L'♘';
            local_78.a.a._10_2_ = 0x54;
            local_78.a.a._12_4_ = 0;
            bVar5 = ::comparesEqual((QLatin1StringView *)&local_78,&local_128);
            if (bVar5) {
              *(undefined1 *)&iVar7._M_node[2]._M_right = 1;
            }
            else {
              local_78.a.a.a._0_4_ = 4;
              local_78.a.a.a._4_4_ = 0;
              local_78.a.a.b = L'♧';
              local_78.a.a._10_2_ = 0x54;
              local_78.a.a._12_4_ = 0;
              bVar5 = ::comparesEqual((QLatin1StringView *)&local_78,&local_128);
              if (bVar5) {
                local_78.a.b.d.d._0_4_ = 0xaaaaaaaa;
                local_78.a.b.d.d._4_4_ = 0xaaaaaaaa;
                local_78.a.a.a._0_4_ = 0xaaaaaaaa;
                local_78.a.a.a._4_4_ = 0xaaaaaaaa;
                local_78.a.a.b = L'ꪪ';
                local_78.a.a._10_2_ = 0xaaaa;
                local_78.a.a._12_4_ = 0xaaaaaaaa;
                QXmlStreamReader::attributes((QXmlStreamAttributes *)&local_e8,&xml);
                qualifiedName_01.m_size = 0x4000000000000007;
                qualifiedName_01.field_0.m_data_utf8 = "pattern";
                local_138 = QXmlStreamAttributes::value
                                      ((QXmlStreamAttributes *)&local_e8,qualifiedName_01);
                QStringView::toString((QString *)&local_78,&local_138);
                QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer
                          ((QArrayDataPointer<QXmlStreamAttribute> *)&local_e8);
                if (local_98.d == (Data *)0x0) {
                  bVar5 = QString::startsWith((QString *)&local_78,(QChar)0x2a,CaseSensitive);
                  if (bVar5) {
                    QString::operator=((QString *)local_a8,(QString *)&local_78);
                  }
                }
                appendIfNew((QStringList *)(iVar7._M_node + 2),(QString *)&local_78);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_78);
              }
            }
            QXmlStreamReader::skipCurrentElement(&xml);
          }
        }
        goto LAB_0044a1be;
      }
    }
    QXmlStreamReader::~QXmlStreamReader(&xml);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_a8);
  }
  QFile::~QFile(&local_f8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
  iVar7._M_node = &p_Var1->_M_header;
LAB_0044a26c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (const_iterator)iVar7._M_node;
  }
  __stack_chk_fail();
}

Assistant:

QMimeBinaryProvider::MimeTypeExtraMap::const_iterator
QMimeBinaryProvider::loadMimeTypeExtra(const QString &mimeName)
{
#if QT_CONFIG(xmlstreamreader)
    auto it = m_mimetypeExtra.find(mimeName);
    if (it == m_mimetypeExtra.cend()) {
        // load comment and globPatterns

        // shared-mime-info since 1.3 lowercases the xml files
        QString mimeFile = m_directory + u'/' + mimeName.toLower() + ".xml"_L1;
        if (!QFile::exists(mimeFile))
            mimeFile = m_directory + u'/' + mimeName + ".xml"_L1; // pre-1.3

        QFile qfile(mimeFile);
        if (!qfile.open(QFile::ReadOnly))
            return m_mimetypeExtra.cend();

        it = m_mimetypeExtra.try_emplace(mimeName).first;
        MimeTypeExtra &extra = it->second;
        QString mainPattern;

        QXmlStreamReader xml(&qfile);
        if (xml.readNextStartElement()) {
            if (xml.name() != "mime-type"_L1) {
                return m_mimetypeExtra.cend();
            }
            const auto name = xml.attributes().value("type"_L1);
            if (name.isEmpty())
                return m_mimetypeExtra.cend();
            if (name.compare(mimeName, Qt::CaseInsensitive))
                qWarning() << "Got name" << name << "in file" << mimeFile << "expected" << mimeName;

            while (xml.readNextStartElement()) {
                const auto tag = xml.name();
                if (tag == "comment"_L1) {
                    QString lang = xml.attributes().value("xml:lang"_L1).toString();
                    const QString text = xml.readElementText();
                    if (lang.isEmpty()) {
                        lang = "default"_L1; // no locale attribute provided, treat it as default.
                    }
                    extra.localeComments.insert(lang, text);
                    continue; // we called readElementText, so we're at the EndElement already.
                } else if (tag == "glob-deleteall"_L1) { // as written out by shared-mime-info >= 0.70
                    extra.hasGlobDeleteAll = true;
                } else if (tag == "glob"_L1) { // as written out by shared-mime-info >= 0.70
                    const QString pattern = xml.attributes().value("pattern"_L1).toString();
                    if (mainPattern.isEmpty() && pattern.startsWith(u'*')) {
                        mainPattern = pattern;
                    }
                    appendIfNew(extra.globPatterns, pattern);
                }
                xml.skipCurrentElement();
            }
            Q_ASSERT(xml.name() == "mime-type"_L1);
        }

        // Let's assume that shared-mime-info is at least version 0.70
        // Otherwise we would need 1) a version check, and 2) code for parsing patterns from the globs file.
        if (!mainPattern.isEmpty() &&
                (extra.globPatterns.isEmpty() || extra.globPatterns.constFirst() != mainPattern)) {
            // ensure it's first in the list of patterns
            extra.globPatterns.removeAll(mainPattern);
            extra.globPatterns.prepend(mainPattern);
        }
    }
    return it;
#else
    Q_UNUSED(mimeName);
    qWarning("Cannot load mime type since QXmlStreamReader is not available.");
    return m_mimetypeExtra.cend();
#endif // feature xmlstreamreader
}